

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O0

void hiberlite::Database::dbUpdate<X>(bean_key *key,X *bean)

{
  allocator local_319;
  string local_318 [32];
  shared_res<hiberlite::autoclosed_con> local_2f8;
  bean_key local_2e8;
  undefined1 local_2d0 [8];
  BeanUpdater u;
  undefined1 local_1a8 [8];
  ChildKiller ck;
  string local_90 [32];
  shared_res<hiberlite::autoclosed_con> local_70;
  allocator local_59;
  string local_58 [48];
  shared_res<hiberlite::autoclosed_con> local_28;
  X *local_18;
  X *bean_local;
  bean_key *key_local;
  
  local_18 = bean;
  bean_local = (X *)key;
  shared_res<hiberlite::autoclosed_con>::shared_res(&local_28,&key->con);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"ROLLBACK TRANSACTION;",&local_59);
  dbExecQuery(&local_28,(string *)local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_28);
  shared_res<hiberlite::autoclosed_con>::shared_res(&local_70,&key->con);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,"BEGIN TRANSACTION;",
             (allocator *)
             ((long)&ck.actor.rowId.c.super__Deque_base<long_long,_std::allocator<long_long>_>.
                     _M_impl.super__Deque_impl_data + 0x4f));
  dbExecQuery(&local_70,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ck.actor.rowId.c.super__Deque_base<long_long,_std::allocator<long_long>_>.
                     _M_impl.super__Deque_impl_data + 0x4f));
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_70);
  ChildKiller::ChildKiller((ChildKiller *)local_1a8);
  bean_key::bean_key((bean_key *)
                     ((long)&u.actor.rowStack.c.
                             super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
                             ._M_impl.super__Deque_impl_data + 0x48),key);
  ChildKiller::killChildren<X>
            ((ChildKiller *)local_1a8,
             (bean_key *)
             ((long)&u.actor.rowStack.c.
                     super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
                     ._M_impl.super__Deque_impl_data + 0x48),local_18);
  bean_key::~bean_key((bean_key *)
                      ((long)&u.actor.rowStack.c.
                              super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
                              ._M_impl.super__Deque_impl_data + 0x48));
  BeanUpdater::BeanUpdater((BeanUpdater *)local_2d0);
  bean_key::bean_key(&local_2e8,key);
  BeanUpdater::update<X>((BeanUpdater *)local_2d0,&local_2e8,local_18);
  bean_key::~bean_key(&local_2e8);
  shared_res<hiberlite::autoclosed_con>::shared_res(&local_2f8,&key->con);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"COMMIT TRANSACTION;",&local_319);
  dbExecQuery(&local_2f8,(string *)local_318);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_2f8);
  BeanUpdater::~BeanUpdater((BeanUpdater *)local_2d0);
  ChildKiller::~ChildKiller((ChildKiller *)local_1a8);
  return;
}

Assistant:

void Database::dbUpdate(bean_key key, C& bean)
{
	try{
		dbExecQuery(key.con,"ROLLBACK TRANSACTION;");
	}catch(...){}
	dbExecQuery(key.con,"BEGIN TRANSACTION;");

		ChildKiller ck;
		ck.killChildren(key,bean);
		BeanUpdater u;
		u.update(key, bean);

	dbExecQuery(key.con,"COMMIT TRANSACTION;");
}